

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

UninterpretedOption_NamePart *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
          (Arena *arena)

{
  UninterpretedOption_NamePart *this;
  
  if (arena == (Arena *)0x0) {
    this = (UninterpretedOption_NamePart *)operator_new(0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&UninterpretedOption_NamePart::typeinfo,0x28);
    }
    this = (UninterpretedOption_NamePart *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}